

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall kj::UnixEventPort::setRunnable(UnixEventPort *this,bool runnable)

{
  undefined3 in_register_00000031;
  
  this->runnable = runnable;
  if ((CONCAT31(in_register_00000031,runnable) != 0) && (this->sleeping == true)) {
    (*(this->super_EventPort)._vptr_EventPort[3])(this);
    this->sleeping = false;
  }
  return;
}

Assistant:

void UnixEventPort::setRunnable(bool runnable) {
  this->runnable = runnable;
  if (runnable && sleeping) {
    // A meta event loop is waiting for the epoll to become readable, and an event was queued
    // directly to the event loop in the meantime (e.g. due to a promise fulfiller being
    // fulfilled). So, we need to cause the epoll to signal readability, to wake the event loop. We
    // can use the cross-thread wake mechanism for this. It'll cause the event loop to spuriously
    // check for cross-thread events, incurring a mutex lock, but that's not a big deal, and that's
    // much better than creating a whole second event FD for this purpose.
    wake();
    sleeping = false;
  }
}